

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

enum_<kratos::EventControl::DelaySide> * __thiscall
pybind11::enum_<kratos::EventControl::DelaySide>::value
          (enum_<kratos::EventControl::DelaySide> *this,char *name,DelaySide value,char *doc)

{
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar1;
  DelaySide local_34;
  handle hStack_30;
  DelaySide value_local;
  
  local_34 = value;
  pVar1 = detail::type_caster_generic::src_and_type
                    (&local_34,(type_info *)&kratos::EventControl::DelaySide::typeinfo,
                     (type_info *)0x0);
  hStack_30 = detail::type_caster_generic::cast
                        (pVar1.first,copy,(handle)0x0,pVar1.second,
                         ::anon_func::anon_class_1_0_00000001::__invoke,
                         ::anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
  detail::enum_base::value(&this->m_base,name,(object *)&stack0xffffffffffffffd0,doc);
  object::~object((object *)&stack0xffffffffffffffd0);
  return this;
}

Assistant:

enum_& value(char const* name, Type value, const char *doc = nullptr) {
        m_base.value(name, pybind11::cast(value, return_value_policy::copy), doc);
        return *this;
    }